

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

ON_BoundingBox * __thiscall
ON_Outline::OutlineBoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Outline *this)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  ON_BoundingBox bbox;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  if (this->m_bbox_status == '\0') {
    this->m_bbox_status = '\a';
    dVar6 = ON_BoundingBox::NanBoundingBox.m_max.z;
    dVar5 = ON_BoundingBox::NanBoundingBox.m_max.y;
    dVar4 = ON_BoundingBox::NanBoundingBox.m_max.x;
    dVar3 = ON_BoundingBox::NanBoundingBox.m_min.z;
    dVar2 = ON_BoundingBox::NanBoundingBox.m_min.y;
    (this->m_bbox).m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
    (this->m_bbox).m_min.y = dVar2;
    (this->m_bbox).m_min.z = dVar3;
    (this->m_bbox).m_max.x = dVar4;
    (this->m_bbox).m_max.y = dVar5;
    (this->m_bbox).m_max.z = dVar6;
    uVar1 = (this->m_figures).m_count;
    if ((ulong)uVar1 != 0) {
      ON_OutlineFigure::BoundingBox(&local_90,(this->m_figures).m_a);
      if (uVar1 != 1) {
        lVar9 = (ulong)uVar1 - 1;
        lVar8 = 0x48;
        do {
          ON_OutlineFigure::BoundingBox
                    (&local_60,
                     (ON_OutlineFigure *)((long)&((this->m_figures).m_a)->m_units_per_em + lVar8));
          ON_BoundingBox::Union(&local_90,&local_60);
          lVar8 = lVar8 + 0x48;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      bVar7 = ON_BoundingBox::IsValid(&local_90);
      if (bVar7) {
        bVar7 = ON_BoundingBox::IsNotEmpty(&local_90);
        if (bVar7) {
          (this->m_bbox).m_max.y = local_90.m_max.y;
          (this->m_bbox).m_max.z = local_90.m_max.z;
          (this->m_bbox).m_min.z = local_90.m_min.z;
          (this->m_bbox).m_max.x = local_90.m_max.x;
          (this->m_bbox).m_min.x = local_90.m_min.x;
          (this->m_bbox).m_min.y = local_90.m_min.y;
          this->m_bbox_status = '\x01';
        }
      }
    }
  }
  dVar2 = (this->m_bbox).m_min.x;
  dVar3 = (this->m_bbox).m_min.y;
  dVar4 = (this->m_bbox).m_min.z;
  dVar5 = (this->m_bbox).m_max.x;
  dVar6 = (this->m_bbox).m_max.z;
  (__return_storage_ptr__->m_max).y = (this->m_bbox).m_max.y;
  (__return_storage_ptr__->m_max).z = dVar6;
  (__return_storage_ptr__->m_min).z = dVar4;
  (__return_storage_ptr__->m_max).x = dVar5;
  (__return_storage_ptr__->m_min).x = dVar2;
  (__return_storage_ptr__->m_min).y = dVar3;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Outline::OutlineBoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;
    m_bbox = ON_BoundingBox::NanBoundingBox;

    const unsigned int figure_count = m_figures.UnsignedCount();
    if (0 == figure_count)
      break;

    ON_BoundingBox bbox = m_figures[0].BoundingBox();
    for (unsigned int i = 1; i < figure_count; i++)
    {
      bbox.Union(m_figures[i].BoundingBox());
    }
    if (bbox.IsValid() && bbox.IsNotEmpty())
    {
      m_bbox = bbox;
      m_bbox_status = 1;
    }
    
    break;
  }

  return m_bbox;
}